

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.h
# Opt level: O1

Polynomial<double> * __thiscall
gmath::Polynomial<double>::operator=(Polynomial<double> *this,Polynomial<double> *p)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  
  increase(this,p->used);
  this->used = 0;
  if (0 < p->used) {
    pdVar1 = p->c;
    pdVar2 = this->c;
    lVar3 = 0;
    do {
      pdVar2[lVar3] = pdVar1[lVar3];
      lVar3 = lVar3 + 1;
      this->used = (int)lVar3;
    } while (lVar3 < p->used);
  }
  return this;
}

Assistant:

Polynomial<T> &operator=(const Polynomial<T> &p)
    {
      increase(p.getDegree()+1);

      for (used=0; used<=p.getDegree(); used++)
      {
        c[used]=p.c[used];
      }

      return *this;
    }